

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O0

void dlib::set_all_logging_output_streams(ostream *out_)

{
  undefined1 uVar1;
  logger **pplVar2;
  hook_mfp hook;
  auto_mutex M;
  global_data *gd;
  rmutex *in_stack_fffffffffffffee8;
  auto_mutex *in_stack_fffffffffffffef0;
  hook_mfp *in_stack_ffffffffffffff10;
  streambuf *in_stack_ffffffffffffff18;
  global_data *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff30;
  allocator in_stack_ffffffffffffff37;
  string *in_stack_ffffffffffffff38;
  global_data *in_stack_ffffffffffffff40;
  allocator local_59;
  string local_58 [72];
  global_data *local_10;
  
  local_10 = logger::get_global_data();
  auto_mutex::auto_mutex(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::reset((set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
           *)0x3d7b22);
  while( true ) {
    uVar1 = set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            ::move_next((set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                         *)0x3d7b37);
    if (!(bool)uVar1) break;
    pplVar2 = set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
              ::element((set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                         *)0x3d7b5b);
    in_stack_ffffffffffffff18 =
         (streambuf *)
         (((*pplVar2)->out)._vptr_basic_ostream[-3] + (long)&((*pplVar2)->out)._vptr_basic_ostream);
    in_stack_ffffffffffffff20 = (global_data *)std::ios::rdbuf();
    std::ios::rdbuf(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff10 =
         (hook_mfp *)
         set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
         ::element((set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
                    *)0x3d7bbc);
    mfp_kernel_1_base_class<4UL>::clear((mfp_kernel_1_base_class<4UL> *)in_stack_ffffffffffffff40);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  logger::global_data::set_output_stream
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (ostream *)
             CONCAT17(in_stack_ffffffffffffff37,CONCAT16(uVar1,in_stack_ffffffffffffff30)));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
  ::member_function_pointer
            ((member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
              *)0x3d7c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff38,"",(allocator *)&stack0xffffffffffffff37);
  logger::global_data::set_output_hook
            (in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10
            );
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
  ::~member_function_pointer
            ((member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
              *)0x3d7cdb);
  auto_mutex::~auto_mutex((auto_mutex *)0x3d7ce8);
  return;
}

Assistant:

void set_all_logging_output_streams (
        std::ostream& out_
    )
    {
        logger::global_data& gd = logger::get_global_data();
        auto_mutex M(gd.m);
        gd.loggers.reset();
        while (gd.loggers.move_next())
        {
            gd.loggers.element()->out.rdbuf(out_.rdbuf());
            gd.loggers.element()->hook.clear();
        }

        gd.set_output_stream("",out_);

        // set the default hook to be an empty member function pointer
        logger::hook_mfp hook;
        gd.set_output_hook("",hook);
    }